

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

bool Js::InterpreterStackFrame::IsDelayDynamicInterpreterThunk(JavascriptMethod entryPoint)

{
  return entryPoint == AsmJsDelayDynamicInterpreterThunk ||
         entryPoint == DelayDynamicInterpreterThunk;
}

Assistant:

bool InterpreterStackFrame::IsDelayDynamicInterpreterThunk(JavascriptMethod entryPoint)
    {
        return false
#if DYNAMIC_INTERPRETER_THUNK
            || entryPoint == InterpreterStackFrame::DelayDynamicInterpreterThunk
#ifdef ASMJS_PLAT
            || entryPoint == InterpreterStackFrame::AsmJsDelayDynamicInterpreterThunk
#endif
#endif
            ;
    }